

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLimiter.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Code code)

{
  char *local_28;
  char *str;
  Code code_local;
  ostream *os_local;
  
  if (code == Ok) {
    local_28 = "Ok (200)";
  }
  else {
    local_28 = "Unknown code";
    if (code == TooManyRequests) {
      local_28 = "Too many requests (429)";
    }
  }
  std::operator<<(os,local_28);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HttpResult::Code code)
{
    const auto str =
        code == HttpResult::Code::Ok ? "Ok (200)" :
        code == HttpResult::Code::TooManyRequests ? "Too many requests (429)" :
        "Unknown code";
    os << str;
    return os;
}